

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

void CheckShortestTex(FTextureID texnum,double *minsize)

{
  bool bVar1;
  int iVar2;
  FTexture *this;
  double h;
  FTexture *tex;
  double *minsize_local;
  FTextureID texnum_local;
  
  minsize_local._4_4_ = texnum.texnum;
  bVar1 = FTextureID::isValid((FTextureID *)((long)&minsize_local + 4));
  if (((bVar1) ||
      ((bVar1 = FTextureID::isNull((FTextureID *)((long)&minsize_local + 4)), bVar1 &&
       ((i_compatflags & 1U) != 0)))) &&
     (this = FTextureManager::operator[](&TexMan,minsize_local._4_4_), this != (FTexture *)0x0)) {
    iVar2 = FTexture::GetScaledHeight(this);
    if ((double)iVar2 < *minsize) {
      *minsize = (double)iVar2;
    }
  }
  return;
}

Assistant:

static inline void CheckShortestTex (FTextureID texnum, double &minsize)
{
	if (texnum.isValid() || (texnum.isNull() && (i_compatflags & COMPATF_SHORTTEX)))
	{
		FTexture *tex = TexMan[texnum];
		if (tex != NULL)
		{
			double h = tex->GetScaledHeight();
			if (h < minsize)
			{
				minsize = h;
			}
		}
	}
}